

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void set_utf8_locale(void)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = setlocale(0,"en_US.UTF-8");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = setlocale(0,"");
    if (pcVar1 == (char *)0x0) {
LAB_00106054:
      error(1,0,"LC_CTYPE locale must be of UTF-8 type, or you need en_US.UTF-8 availabe");
      return;
    }
    pcVar2 = strstr(pcVar1,"UTF-8");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strstr(pcVar1,"UTF8");
      if (pcVar2 == (char *)0x0) {
        pcVar2 = strstr(pcVar1,"utf-8");
        if (pcVar2 == (char *)0x0) {
          pcVar1 = strstr(pcVar1,"utf8");
          if (pcVar1 == (char *)0x0) goto LAB_00106054;
        }
      }
    }
  }
  return;
}

Assistant:

void set_utf8_locale()
{
    // set locale to common UTF-8 for wchars to be recognized correctly
    if(setlocale(LC_CTYPE, "en_US.UTF-8") == NULL) {             // if en_US.UTF-8 isn't available
        char *locale = setlocale(LC_CTYPE, "");                         // try the locale that corresponds to the value of the associated environment variable LC_CTYPE
        if (locale != NULL &&
            (strstr(locale, "UTF-8") != NULL || strstr(locale, "UTF8") != NULL ||
             strstr(locale, "utf-8") != NULL || strstr(locale, "utf8") != NULL) )
            ;                                     // if locale has "UTF-8" in its name, it is cool to do nothing
        else
            error(EXIT_FAILURE, 0, "LC_CTYPE locale must be of UTF-8 type, or you need en_US.UTF-8 availabe");
    }
}